

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSim.c
# Opt level: O0

int Gia_ManIncrSimCheckEqual(Gia_Man_t *p,int iLit0,int iLit1)

{
  int iVar1;
  int iLit1_local;
  int iLit0_local;
  Gia_Man_t *p_local;
  
  if ((1 < iLit0) && (1 < iLit1)) {
    Gia_ManIncrSimUpdate(p);
    iVar1 = Abc_Lit2Var(iLit0);
    Gia_ManIncrSimCone_rec(p,iVar1);
    iVar1 = Abc_Lit2Var(iLit1);
    Gia_ManIncrSimCone_rec(p,iVar1);
    iVar1 = Gia_ManBuiltInSimCheckEqual(p,iLit0,iLit1);
    return iVar1;
  }
  __assert_fail("iLit0 > 1 && iLit1 > 1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSim.c"
                ,0x4c0,"int Gia_ManIncrSimCheckEqual(Gia_Man_t *, int, int)");
}

Assistant:

int Gia_ManIncrSimCheckEqual( Gia_Man_t * p, int iLit0, int iLit1 )
{
    assert( iLit0 > 1 && iLit1 > 1 );
    Gia_ManIncrSimUpdate( p );
    Gia_ManIncrSimCone_rec( p, Abc_Lit2Var(iLit0) );
    Gia_ManIncrSimCone_rec( p, Abc_Lit2Var(iLit1) );
//    return 1; // disable
    return Gia_ManBuiltInSimCheckEqual( p, iLit0, iLit1 );
}